

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noui.cpp
# Opt level: O2

bool noui_ThreadSafeQuestion(bilingual_str *param_1,string *message,string *caption,uint style)

{
  long in_FS_OFFSET;
  string in_stack_ffffffffffffff78;
  bilingual_str local_60;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string((string *)&stack0xffffffffffffff80,message);
  Untranslated(&local_60,in_stack_ffffffffffffff78);
  noui_ThreadSafeMessageBox(&local_60,caption,style);
  bilingual_str::~bilingual_str(&local_60);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return false;
  }
  __stack_chk_fail();
}

Assistant:

bool noui_ThreadSafeQuestion(const bilingual_str& /* ignored interactive message */, const std::string& message, const std::string& caption, unsigned int style)
{
    return noui_ThreadSafeMessageBox(Untranslated(message), caption, style);
}